

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tweakable.cpp
# Opt level: O0

string * Corrade::Utility::Implementation::findTweakableAlias
                   (string *__return_storage_ptr__,string *data)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  BasicStringView<const_char> BVar6;
  StringView prefix;
  string local_a0 [32];
  StringView local_80;
  BasicStringView<const_char> local_70;
  BasicStringView<const_char> local_60;
  size_t local_50;
  size_t end;
  size_t beg;
  size_t prev;
  size_t pos;
  allocator local_1a;
  undefined1 local_19;
  string *local_18;
  string *data_local;
  string *name;
  
  local_19 = 0;
  local_18 = data;
  data_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"CORRADE_TWEAKABLE",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  prev = 0;
LAB_001a3345:
  beg = std::__cxx11::string::find((char *)local_18,0x1c22dd);
  prev = beg;
  if (beg == 0xffffffffffffffff) {
    return __return_storage_ptr__;
  }
  while( true ) {
    bVar5 = false;
    if (beg != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      bVar5 = true;
      if (*pcVar2 != ' ') {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
        bVar5 = *pcVar2 == '\t';
      }
    }
    if (!bVar5) break;
    beg = beg - 1;
  }
  prev = prev + 7;
  if (beg != 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar2 != '\n') goto LAB_001a3345;
  }
  end = prev;
  anon_unknown_2::eatWhitespace(local_18,&end);
  local_50 = end;
  do {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar2 < 'A') {
LAB_001a3485:
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if ('`' < *pcVar2) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
        bVar5 = true;
        if (*pcVar2 < '{') goto LAB_001a350f;
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if ('/' < *pcVar2) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
        if ((*pcVar2 < ':') && (bVar5 = true, local_50 != prev)) goto LAB_001a350f;
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      bVar5 = *pcVar2 == '_';
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      bVar5 = true;
      if ('Z' < *pcVar2) goto LAB_001a3485;
    }
LAB_001a350f:
    if (!bVar5) break;
    local_50 = local_50 + 1;
  } while( true );
  prev = local_50;
  anon_unknown_2::eatWhitespace(local_18,&prev);
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_70,local_18);
  BVar6 = Containers::BasicStringView<const_char>::exceptPrefix(&local_70,prev);
  local_60 = BVar6;
  prefix = Containers::Literals::StringLiterals::operator____s("CORRADE_TWEAKABLE",0x11);
  local_80 = prefix;
  bVar5 = Containers::BasicStringView<const_char>::hasPrefix(&local_60,prefix);
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    lVar3 = std::__cxx11::string::size();
    prev = prev + lVar3;
    anon_unknown_2::eatWhitespace(local_18,&prev);
    sVar1 = prev;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= sVar1) goto LAB_001a3688;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar2 == '\r') goto LAB_001a3688;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar2 == '\n') {
LAB_001a3688:
      std::__cxx11::string::substr((ulong)local_a0,(ulong)local_18);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_a0);
      std::__cxx11::string::~string(local_a0);
      return __return_storage_ptr__;
    }
  }
  goto LAB_001a3345;
}

Assistant:

std::string findTweakableAlias(const std::string& data) {
    using namespace Containers::Literals;

    std::string name = "CORRADE_TWEAKABLE";
    std::size_t pos = 0;
    while((pos = data.find("#define", pos)) != std::string::npos) {
        /* Eat all whitespace before */
        std::size_t prev = pos;
        while(prev && (data[prev - 1] == ' ' || data[prev - 1] == '\t'))
            --prev;

        /* Skip what we found, so `continue`s will not cause an infinite loop */
        pos += 7;

        /* If this is not at the start of a line (or first in the file), nope */
        if(prev && data[prev - 1] != '\n')
            continue;

        /* Get rid of whitespace */
        std::size_t beg = pos;
        eatWhitespace(data, beg);

        /* Consume the name */
        std::size_t end = beg;
        while((data[end] >= 'A' && data[end] <= 'Z') ||
              (data[end] >= 'a' && data[end] <= 'z') ||
              (data[end] >= '0' && data[end] <= '9' && end != pos) ||
              (data[end] == '_')) ++end;

        /* Get rid of whitespace after */
        pos = end;
        eatWhitespace(data, pos);

        /* If the rest doesn't read CORRADE_TWEAKABLE, nope */
        /** @todo convert all this to operate on StringViews when we have
            find() as well */
        if(!Containers::StringView{data}.exceptPrefix(pos).hasPrefix("CORRADE_TWEAKABLE"_s))
            continue;

        /* Get rid of whitespace at the end of the line */
        pos += name.size();
        eatWhitespace(data, pos);

        /* If there is something else than a newline or EOF, nope */
        if(pos < data.size() && data[pos] != '\r' && data[pos] != '\n')
            continue;

        /* Save the name */
        name = data.substr(beg, end - beg);
        break;
    }

    return name;
}